

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

__pid_t __thiscall cs::process_context::fork(process_context *this)

{
  int iVar1;
  pointer ppVar2;
  string *psVar3;
  process_context *curr;
  unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> new_process;
  pointer in_stack_ffffffffffffff08;
  event_type *in_stack_ffffffffffffff10;
  unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *this_00;
  anon_class_8_1_898a7330 *in_stack_ffffffffffffff18;
  cs_exception_handler p_Var4;
  function<bool_(void_*)> *in_stack_ffffffffffffff20;
  event_type *this_01;
  size_t in_stack_ffffffffffffffc8;
  process_context *in_stack_ffffffffffffffd0;
  
  operator_new(0x110);
  child_stack_size((process_context *)current_process);
  process_context(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_ptr<cs::process_context,std::default_delete<cs::process_context>>::
  unique_ptr<std::default_delete<cs::process_context>,void>
            ((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  iVar1 = *(int *)(current_process + 0x50);
  ppVar2 = std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::
           operator->((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)
                      0x200821);
  ppVar2->output_precision = iVar1;
  psVar3 = (string *)(current_process + 0x58);
  ppVar2 = std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::
           operator->((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)
                      0x200846);
  std::__cxx11::string::operator=((string *)&ppVar2->import_path,psVar3);
  std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::operator->
            ((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)0x200878)
  ;
  std::function<bool(void*)>::function<cs::process_context::fork()::__0,void>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  event_type::add_listener(in_stack_ffffffffffffff10,(listener_type *)in_stack_ffffffffffffff08);
  std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x2008cb);
  ppVar2 = std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::
           operator->((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)
                      0x2008d8);
  this_01 = &ppVar2->on_process_sigint;
  std::function<bool(void*)>::function<cs::process_context::fork()::__1,void>
            ((function<bool_(void_*)> *)this_01,in_stack_ffffffffffffff18);
  event_type::add_listener(in_stack_ffffffffffffff10,(listener_type *)in_stack_ffffffffffffff08);
  std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x200925);
  this_00 = *(unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> **)
             (current_process + 0xf8);
  ppVar2 = std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::
           operator->((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)
                      0x200948);
  ppVar2->std_eh_callback = (std_exception_handler)this_00;
  p_Var4 = *(cs_exception_handler *)(current_process + 0x100);
  ppVar2 = std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::
           operator->((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)
                      0x200977);
  ppVar2->cs_eh_callback = p_Var4;
  std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::unique_ptr
            (this_00,(unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)
                     in_stack_ffffffffffffff08);
  std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::~unique_ptr
            ((unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *)this_01);
  return (__pid_t)this;
}

Assistant:

std::unique_ptr<process_context> process_context::fork()
	{
		std::unique_ptr<process_context> new_process(new process_context(current_process->child_stack_size()));
		new_process->output_precision = current_process->output_precision;
		new_process->import_path = current_process->import_path;
		process_context *curr = current_process;
		new_process->on_process_exit.add_listener([curr](void *data) -> bool {
			return curr->on_process_exit.touch(data);
		});
		new_process->on_process_sigint.add_listener([curr](void *data) -> bool {
			return curr->on_process_sigint.touch(data);
		});
		new_process->std_eh_callback = current_process->std_eh_callback;
		new_process->cs_eh_callback = current_process->cs_eh_callback;
		return std::move(new_process);
	}